

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O1

RefPtr<wabt::interp::Trap> * __thiscall
wabt::interp::RefPtr<wabt::interp::Object>::As<wabt::interp::Trap>
          (RefPtr<wabt::interp::Trap> *__return_storage_ptr__,RefPtr<wabt::interp::Object> *this)

{
  Trap *pTVar1;
  Store *this_00;
  Object *pOVar2;
  Index IVar3;
  
  pTVar1 = (Trap *)this->obj_;
  this_00 = this->store_;
  pOVar2 = (this_00->objects_).list_.
           super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
           _M_impl.super__Vector_impl_data._M_start[(pTVar1->super_Object).self_.index];
  if ((((ulong)pOVar2 & 1) == 0) && (pOVar2->kind_ == Trap)) {
    __return_storage_ptr__->obj_ = (Trap *)0x0;
    __return_storage_ptr__->store_ = (Store *)0x0;
    __return_storage_ptr__->root_index_ = 0;
    __return_storage_ptr__->obj_ = pTVar1;
    __return_storage_ptr__->store_ = this_00;
    IVar3 = Store::CopyRoot(this_00,this->root_index_);
    __return_storage_ptr__->root_index_ = IVar3;
    return __return_storage_ptr__;
  }
  __assert_fail("store_->Is<U>(obj_->self())",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/interp/interp-inl.h"
                ,0x15a,
                "RefPtr<U> wabt::interp::RefPtr<wabt::interp::Object>::As() [T = wabt::interp::Object, U = wabt::interp::Trap]"
               );
}

Assistant:

RefPtr<U> RefPtr<T>::As() {
  static_assert(std::is_base_of<T, U>::value, "T must be base class of U");
  assert(store_->Is<U>(obj_->self()));
  RefPtr<U> result;
  result.obj_ = static_cast<U*>(obj_);
  result.store_ = store_;
  result.root_index_ = store_->CopyRoot(root_index_);
  return result;
}